

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ushort uVar11;
  ushort uVar12;
  Geometry *pGVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  uint uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 (*pauVar30) [16];
  byte bVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  byte bVar48;
  ulong uVar49;
  ulong uVar50;
  float fVar51;
  float fVar96;
  float fVar97;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar98;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1381;
  ulong local_1380;
  size_t local_1378;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  ulong local_1330;
  ulong local_1328;
  ulong local_1320;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  long local_1300;
  long local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  ulong local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  undefined1 (*local_12c8) [16];
  long local_12c0;
  ulong local_12b8;
  RTCFilterFunctionNArguments local_12b0;
  undefined1 local_1280 [32];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 *local_1120;
  byte local_1118;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  float local_10a0 [4];
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  uint uStack_1064;
  undefined1 local_1060 [32];
  float local_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar56 [16];
  
  pauVar40 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar7 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1220._4_4_ = uVar7;
  local_1220._0_4_ = uVar7;
  local_1220._8_4_ = uVar7;
  local_1220._12_4_ = uVar7;
  auVar139 = ZEXT1664(local_1220);
  uVar7 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_11c0._4_4_ = uVar7;
  local_11c0._0_4_ = uVar7;
  local_11c0._8_4_ = uVar7;
  local_11c0._12_4_ = uVar7;
  auVar141 = ZEXT1664(local_11c0);
  uVar7 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_11d0._4_4_ = uVar7;
  local_11d0._0_4_ = uVar7;
  local_11d0._8_4_ = uVar7;
  local_11d0._12_4_ = uVar7;
  auVar144 = ZEXT1664(local_11d0);
  fVar123 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar51 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar97 = fVar123 * 0.99999964;
  local_1230._4_4_ = fVar97;
  local_1230._0_4_ = fVar97;
  local_1230._8_4_ = fVar97;
  local_1230._12_4_ = fVar97;
  auVar136 = ZEXT1664(local_1230);
  fVar97 = fVar51 * 0.99999964;
  local_1240._4_4_ = fVar97;
  local_1240._0_4_ = fVar97;
  local_1240._8_4_ = fVar97;
  local_1240._12_4_ = fVar97;
  auVar140 = ZEXT1664(local_1240);
  fVar97 = fVar96 * 0.99999964;
  local_1250._4_4_ = fVar97;
  local_1250._0_4_ = fVar97;
  local_1250._8_4_ = fVar97;
  local_1250._12_4_ = fVar97;
  auVar133 = ZEXT1664(local_1250);
  fVar123 = fVar123 * 1.0000004;
  fVar51 = fVar51 * 1.0000004;
  local_1200 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar96 * 1.0000004)));
  auVar146 = ZEXT1664(local_1200);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = uVar42 ^ 0x10;
  uVar45 = uVar43 ^ 0x10;
  uVar39 = uVar46 ^ 0x10;
  local_1210 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar147 = ZEXT1664(local_1210);
  auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar148 = ZEXT1664(auVar52);
  local_1308 = uVar42 >> 2;
  local_1310 = uVar44 >> 2;
  local_1318 = uVar43 >> 2;
  local_1320 = uVar45 >> 2;
  local_1328 = uVar46 >> 2;
  local_1330 = uVar39 >> 2;
  local_11a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar96 = fVar123;
  fVar97 = fVar123;
  fVar98 = fVar123;
  fVar99 = fVar51;
  fVar100 = fVar51;
  fVar101 = fVar51;
  local_1380 = uVar39;
  local_1378 = k;
  local_12f0 = uVar45;
  local_12e8 = uVar44;
  local_12e0 = uVar46;
  local_12d8 = uVar43;
  local_12d0 = uVar42;
  local_11f0 = fVar51;
  fStack_11ec = fVar51;
  fStack_11e8 = fVar51;
  fStack_11e4 = fVar51;
  local_11e0 = fVar123;
  fStack_11dc = fVar123;
  fStack_11d8 = fVar123;
  fStack_11d4 = fVar123;
LAB_01cf5153:
  do {
    do {
      if (pauVar40 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar30 = pauVar40 + -1;
      pauVar40 = pauVar40 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar30 + 8));
    uVar49 = *(size_t *)*pauVar40;
    while (local_11b0 = auVar148._0_16_, (uVar49 & 8) == 0) {
      auVar63 = auVar139._0_16_;
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar42),auVar63);
      auVar56._0_4_ = auVar136._0_4_ * auVar52._0_4_;
      auVar56._4_4_ = auVar136._4_4_ * auVar52._4_4_;
      auVar56._8_4_ = auVar136._8_4_ * auVar52._8_4_;
      auVar56._12_4_ = auVar136._12_4_ * auVar52._12_4_;
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar43),auVar141._0_16_);
      auVar53._0_4_ = auVar140._0_4_ * auVar52._0_4_;
      auVar53._4_4_ = auVar140._4_4_ * auVar52._4_4_;
      auVar53._8_4_ = auVar140._8_4_ * auVar52._8_4_;
      auVar53._12_4_ = auVar140._12_4_ * auVar52._12_4_;
      auVar52 = vmaxps_avx(auVar56,auVar53);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar46),auVar144._0_16_);
      auVar54._0_4_ = auVar133._0_4_ * auVar56._0_4_;
      auVar54._4_4_ = auVar133._4_4_ * auVar56._4_4_;
      auVar54._8_4_ = auVar133._8_4_ * auVar56._8_4_;
      auVar54._12_4_ = auVar133._12_4_ * auVar56._12_4_;
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar44),auVar63);
      auVar119._0_4_ = fVar123 * auVar56._0_4_;
      auVar119._4_4_ = fVar96 * auVar56._4_4_;
      auVar119._8_4_ = fVar97 * auVar56._8_4_;
      auVar119._12_4_ = fVar98 * auVar56._12_4_;
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar45),auVar141._0_16_);
      auVar124._0_4_ = fVar51 * auVar56._0_4_;
      auVar124._4_4_ = fVar99 * auVar56._4_4_;
      auVar124._8_4_ = fVar100 * auVar56._8_4_;
      auVar124._12_4_ = fVar101 * auVar56._12_4_;
      auVar56 = vminps_avx(auVar119,auVar124);
      auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar39),auVar144._0_16_);
      auVar53 = vmulps_avx512vl(auVar146._0_16_,auVar53);
      auVar54 = vmaxps_avx512vl(auVar54,auVar147._0_16_);
      auVar52 = vmaxps_avx(auVar52,auVar54);
      auVar53 = vminps_avx512vl(auVar53,local_11b0);
      auVar56 = vminps_avx(auVar56,auVar53);
      uVar50 = vcmpps_avx512vl(auVar52,auVar56,2);
      local_1180._0_16_ = auVar52;
      if ((char)uVar50 == '\0') goto LAB_01cf5153;
      uVar47 = uVar49 & 0xfffffffffffffff0;
      lVar32 = 0;
      for (uVar49 = uVar50; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar49 = *(ulong *)(uVar47 + lVar32 * 8);
      uVar34 = (uint)uVar50 - 1 & (uint)uVar50;
      uVar50 = (ulong)uVar34;
      if (uVar34 != 0) {
        uVar36 = *(uint *)(local_1180 + lVar32 * 4);
        lVar32 = 0;
        for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar34 = uVar34 - 1 & uVar34;
        uVar37 = (ulong)uVar34;
        uVar50 = *(ulong *)(uVar47 + lVar32 * 8);
        uVar35 = *(uint *)(local_1180 + lVar32 * 4);
        uVar39 = local_1380;
        if (uVar34 == 0) {
          if (uVar36 < uVar35) {
            *(ulong *)*pauVar40 = uVar50;
            *(uint *)((long)*pauVar40 + 8) = uVar35;
            pauVar40 = pauVar40 + 1;
          }
          else {
            *(ulong *)*pauVar40 = uVar49;
            *(uint *)((long)*pauVar40 + 8) = uVar36;
            pauVar40 = pauVar40 + 1;
            uVar49 = uVar50;
          }
        }
        else {
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar49;
          auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar36));
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar50;
          auVar56 = vpunpcklqdq_avx(auVar111,ZEXT416(uVar35));
          lVar32 = 0;
          for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar32 = lVar32 + 1;
          }
          uVar34 = uVar34 - 1 & uVar34;
          uVar49 = (ulong)uVar34;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = *(ulong *)(uVar47 + lVar32 * 8);
          auVar124 = vpunpcklqdq_avx(auVar112,ZEXT416(*(uint *)(local_1180 + lVar32 * 4)));
          auVar53 = vpshufd_avx(auVar52,0xaa);
          auVar54 = vpshufd_avx(auVar56,0xaa);
          auVar119 = vpshufd_avx(auVar124,0xaa);
          if (uVar34 == 0) {
            uVar49 = vpcmpgtd_avx512vl(auVar54,auVar53);
            uVar49 = uVar49 & 0xf;
            auVar54 = vpblendmd_avx512vl(auVar56,auVar52);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar55._0_4_ = (uint)bVar16 * auVar54._0_4_ | (uint)!bVar16 * auVar53._0_4_;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar16 * auVar54._4_4_ | (uint)!bVar16 * auVar53._4_4_;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar16 * auVar54._8_4_ | (uint)!bVar16 * auVar53._8_4_;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar55._12_4_ = (uint)bVar16 * auVar54._12_4_ | (uint)!bVar16 * auVar53._12_4_;
            auVar56 = vmovdqa32_avx512vl(auVar56);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar57._0_4_ = (uint)bVar16 * auVar56._0_4_ | (uint)!bVar16 * auVar52._0_4_;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar16 * auVar56._4_4_ | (uint)!bVar16 * auVar52._4_4_;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar16 * auVar56._8_4_ | (uint)!bVar16 * auVar52._8_4_;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar57._12_4_ = (uint)bVar16 * auVar56._12_4_ | (uint)!bVar16 * auVar52._12_4_;
            auVar52 = vpshufd_avx(auVar55,0xaa);
            uVar50 = vpcmpgtd_avx512vl(auVar119,auVar52);
            uVar50 = uVar50 & 0xf;
            auVar56 = vpblendmd_avx512vl(auVar124,auVar55);
            bVar16 = (bool)((byte)uVar50 & 1);
            bVar17 = (bool)((byte)(uVar50 >> 1) & 1);
            uVar49 = CONCAT44((uint)bVar17 * auVar56._4_4_ | (uint)!bVar17 * auVar52._4_4_,
                              (uint)bVar16 * auVar56._0_4_ | (uint)!bVar16 * auVar52._0_4_);
            auVar52 = vmovdqa32_avx512vl(auVar124);
            bVar16 = (bool)((byte)uVar50 & 1);
            auVar58._0_4_ = (uint)bVar16 * auVar52._0_4_ | !bVar16 * auVar55._0_4_;
            bVar16 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar16 * auVar52._4_4_ | !bVar16 * auVar55._4_4_;
            bVar16 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar16 * auVar52._8_4_ | !bVar16 * auVar55._8_4_;
            bVar16 = SUB81(uVar50 >> 3,0);
            auVar58._12_4_ = (uint)bVar16 * auVar52._12_4_ | !bVar16 * auVar55._12_4_;
            auVar52 = vpshufd_avx(auVar58,0xaa);
            auVar56 = vpshufd_avx(auVar57,0xaa);
            uVar50 = vpcmpgtd_avx512vl(auVar52,auVar56);
            uVar50 = uVar50 & 0xf;
            auVar56 = vpblendmd_avx512vl(auVar58,auVar57);
            bVar16 = (bool)((byte)uVar50 & 1);
            auVar59._0_4_ = (uint)bVar16 * auVar56._0_4_ | (uint)!bVar16 * auVar52._0_4_;
            bVar16 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar59._4_4_ = (uint)bVar16 * auVar56._4_4_ | (uint)!bVar16 * auVar52._4_4_;
            bVar16 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar59._8_4_ = (uint)bVar16 * auVar56._8_4_ | (uint)!bVar16 * auVar52._8_4_;
            bVar16 = SUB81(uVar50 >> 3,0);
            auVar59._12_4_ = (uint)bVar16 * auVar56._12_4_ | (uint)!bVar16 * auVar52._12_4_;
            auVar52 = vmovdqa32_avx512vl(auVar58);
            bVar16 = (bool)((byte)uVar50 & 1);
            auVar60._0_4_ = (uint)bVar16 * auVar52._0_4_ | !bVar16 * auVar57._0_4_;
            bVar16 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar16 * auVar52._4_4_ | !bVar16 * auVar57._4_4_;
            bVar16 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar16 * auVar52._8_4_ | !bVar16 * auVar57._8_4_;
            bVar16 = SUB81(uVar50 >> 3,0);
            auVar60._12_4_ = (uint)bVar16 * auVar52._12_4_ | !bVar16 * auVar57._12_4_;
            *pauVar40 = auVar60;
            pauVar40[1] = auVar59;
            pauVar40 = pauVar40 + 2;
          }
          else {
            lVar32 = 0;
            for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar34 = *(uint *)(local_1180 + lVar32 * 4);
            auVar134._8_8_ = 0;
            auVar134._0_8_ = *(ulong *)(uVar47 + lVar32 * 8);
            auVar111 = vpunpcklqdq_avx(auVar134,ZEXT416(uVar34));
            uVar49 = vpcmpgtd_avx512vl(auVar54,auVar53);
            uVar49 = uVar49 & 0xf;
            auVar54 = vpblendmd_avx512vl(auVar56,auVar52);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar61._0_4_ = (uint)bVar16 * auVar54._0_4_ | (uint)!bVar16 * auVar53._0_4_;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar16 * auVar54._4_4_ | (uint)!bVar16 * auVar53._4_4_;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar16 * auVar54._8_4_ | (uint)!bVar16 * auVar53._8_4_;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar61._12_4_ = (uint)bVar16 * auVar54._12_4_ | (uint)!bVar16 * auVar53._12_4_;
            auVar56 = vmovdqa32_avx512vl(auVar56);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar62._0_4_ = (uint)bVar16 * auVar56._0_4_ | (uint)!bVar16 * auVar52._0_4_;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar16 * auVar56._4_4_ | (uint)!bVar16 * auVar52._4_4_;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar16 * auVar56._8_4_ | (uint)!bVar16 * auVar52._8_4_;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar62._12_4_ = (uint)bVar16 * auVar56._12_4_ | (uint)!bVar16 * auVar52._12_4_;
            auVar120._4_4_ = uVar34;
            auVar120._0_4_ = uVar34;
            auVar120._8_4_ = uVar34;
            auVar120._12_4_ = uVar34;
            auVar139 = ZEXT1664(auVar63);
            auVar140 = ZEXT1664(auVar140._0_16_);
            uVar49 = vpcmpgtd_avx512vl(auVar120,auVar119);
            uVar49 = uVar49 & 0xf;
            auVar52 = vpblendmd_avx512vl(auVar111,auVar124);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar63._0_4_ = (uint)bVar16 * auVar52._0_4_ | !bVar16 * uVar34;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar16 * auVar52._4_4_ | !bVar16 * uVar34;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar16 * auVar52._8_4_ | !bVar16 * uVar34;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar63._12_4_ = (uint)bVar16 * auVar52._12_4_ | !bVar16 * uVar34;
            auVar52 = vmovdqa32_avx512vl(auVar111);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar64._0_4_ = (uint)bVar16 * auVar52._0_4_ | (uint)!bVar16 * auVar124._0_4_;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar16 * auVar52._4_4_ | (uint)!bVar16 * auVar124._4_4_;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar16 * auVar52._8_4_ | (uint)!bVar16 * auVar124._8_4_;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar64._12_4_ = (uint)bVar16 * auVar52._12_4_ | (uint)!bVar16 * auVar124._12_4_;
            auVar136 = ZEXT1664(auVar136._0_16_);
            auVar52 = vpshufd_avx(auVar64,0xaa);
            auVar56 = vpshufd_avx(auVar62,0xaa);
            uVar49 = vpcmpgtd_avx512vl(auVar52,auVar56);
            uVar49 = uVar49 & 0xf;
            auVar56 = vpblendmd_avx512vl(auVar64,auVar62);
            bVar16 = (bool)((byte)uVar49 & 1);
            auVar65._0_4_ = (uint)bVar16 * auVar56._0_4_ | (uint)!bVar16 * auVar52._0_4_;
            bVar16 = (bool)((byte)(uVar49 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar16 * auVar56._4_4_ | (uint)!bVar16 * auVar52._4_4_;
            bVar16 = (bool)((byte)(uVar49 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar16 * auVar56._8_4_ | (uint)!bVar16 * auVar52._8_4_;
            bVar16 = SUB81(uVar49 >> 3,0);
            auVar65._12_4_ = (uint)bVar16 * auVar56._12_4_ | (uint)!bVar16 * auVar52._12_4_;
            auVar53 = vmovdqa32_avx512vl(auVar64);
            bVar16 = (bool)((byte)uVar49 & 1);
            bVar18 = (bool)((byte)(uVar49 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar49 >> 2) & 1);
            bVar21 = SUB81(uVar49 >> 3,0);
            auVar52 = vpshufd_avx(auVar63,0xaa);
            auVar56 = vpshufd_avx(auVar61,0xaa);
            uVar50 = vpcmpgtd_avx512vl(auVar52,auVar56);
            uVar50 = uVar50 & 0xf;
            auVar56 = vpblendmd_avx512vl(auVar63,auVar61);
            bVar17 = (bool)((byte)uVar50 & 1);
            bVar19 = (bool)((byte)(uVar50 >> 1) & 1);
            uVar49 = CONCAT44((uint)bVar19 * auVar56._4_4_ | (uint)!bVar19 * auVar52._4_4_,
                              (uint)bVar17 * auVar56._0_4_ | (uint)!bVar17 * auVar52._0_4_);
            auVar52 = vmovdqa32_avx512vl(auVar63);
            bVar17 = (bool)((byte)uVar50 & 1);
            auVar66._0_4_ = (uint)bVar17 * auVar52._0_4_ | !bVar17 * auVar61._0_4_;
            bVar17 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar17 * auVar52._4_4_ | !bVar17 * auVar61._4_4_;
            bVar17 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar17 * auVar52._8_4_ | !bVar17 * auVar61._8_4_;
            bVar17 = SUB81(uVar50 >> 3,0);
            auVar66._12_4_ = (uint)bVar17 * auVar52._12_4_ | !bVar17 * auVar61._12_4_;
            auVar52 = vpshufd_avx(auVar66,0xaa);
            auVar56 = vpshufd_avx(auVar65,0xaa);
            uVar50 = vpcmpgtd_avx512vl(auVar56,auVar52);
            uVar50 = uVar50 & 0xf;
            auVar56 = vpblendmd_avx512vl(auVar65,auVar66);
            bVar17 = (bool)((byte)uVar50 & 1);
            auVar67._0_4_ = (uint)bVar17 * auVar56._0_4_ | (uint)!bVar17 * auVar52._0_4_;
            bVar17 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar67._4_4_ = (uint)bVar17 * auVar56._4_4_ | (uint)!bVar17 * auVar52._4_4_;
            bVar17 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar67._8_4_ = (uint)bVar17 * auVar56._8_4_ | (uint)!bVar17 * auVar52._8_4_;
            bVar17 = SUB81(uVar50 >> 3,0);
            auVar67._12_4_ = (uint)bVar17 * auVar56._12_4_ | (uint)!bVar17 * auVar52._12_4_;
            auVar52 = vmovdqa32_avx512vl(auVar65);
            bVar17 = (bool)((byte)uVar50 & 1);
            auVar68._0_4_ = (uint)bVar17 * auVar52._0_4_ | !bVar17 * auVar66._0_4_;
            bVar17 = (bool)((byte)(uVar50 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar17 * auVar52._4_4_ | !bVar17 * auVar66._4_4_;
            bVar17 = (bool)((byte)(uVar50 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar17 * auVar52._8_4_ | !bVar17 * auVar66._8_4_;
            bVar17 = SUB81(uVar50 >> 3,0);
            auVar68._12_4_ = (uint)bVar17 * auVar52._12_4_ | !bVar17 * auVar66._12_4_;
            *(uint *)*pauVar40 = (uint)bVar16 * auVar53._0_4_ | !bVar16 * auVar62._0_4_;
            *(uint *)((long)*pauVar40 + 4) = (uint)bVar18 * auVar53._4_4_ | !bVar18 * auVar62._4_4_;
            *(uint *)((long)*pauVar40 + 8) = (uint)bVar20 * auVar53._8_4_ | !bVar20 * auVar62._8_4_;
            *(uint *)((long)*pauVar40 + 0xc) =
                 (uint)bVar21 * auVar53._12_4_ | !bVar21 * auVar62._12_4_;
            pauVar40[1] = auVar68;
            pauVar40[2] = auVar67;
            pauVar40 = pauVar40 + 3;
          }
          auVar133 = ZEXT1664(auVar133._0_16_);
        }
      }
    }
    local_1300 = (ulong)((uint)uVar49 & 0xf) - 8;
    uVar49 = uVar49 & 0xfffffffffffffff0;
    local_12c8 = pauVar40;
    for (local_12f8 = 0; local_12f8 != local_1300; local_12f8 = local_12f8 + 1) {
      lVar32 = local_12f8 * 0x58;
      local_12c0 = uVar49 + lVar32;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = *(ulong *)(uVar49 + 0x20 + lVar32);
      auVar113._8_8_ = 0;
      auVar113._0_8_ = *(ulong *)(uVar49 + 0x24 + lVar32);
      uVar24 = vpcmpub_avx512vl(auVar102,auVar113,2);
      uVar7 = *(undefined4 *)(uVar49 + 0x38 + lVar32);
      auVar103._4_4_ = uVar7;
      auVar103._0_4_ = uVar7;
      auVar103._8_4_ = uVar7;
      auVar103._12_4_ = uVar7;
      uVar7 = *(undefined4 *)(uVar49 + 0x44 + lVar32);
      auVar114._4_4_ = uVar7;
      auVar114._0_4_ = uVar7;
      auVar114._8_4_ = uVar7;
      auVar114._12_4_ = uVar7;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = *(ulong *)(local_1308 + 0x20 + local_12c0);
      auVar52 = vpmovzxbd_avx(auVar121);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar56 = vfmadd213ps_fma(auVar52,auVar114,auVar103);
      auVar125._8_8_ = 0;
      auVar125._0_8_ = *(ulong *)(local_1310 + 0x20 + local_12c0);
      auVar52 = vpmovzxbd_avx(auVar125);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar53 = vfmadd213ps_fma(auVar52,auVar114,auVar103);
      uVar7 = *(undefined4 *)(uVar49 + 0x3c + lVar32);
      auVar104._4_4_ = uVar7;
      auVar104._0_4_ = uVar7;
      auVar104._8_4_ = uVar7;
      auVar104._12_4_ = uVar7;
      uVar7 = *(undefined4 *)(uVar49 + 0x48 + lVar32);
      auVar115._4_4_ = uVar7;
      auVar115._0_4_ = uVar7;
      auVar115._8_4_ = uVar7;
      auVar115._12_4_ = uVar7;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = *(ulong *)(local_1318 + 0x20 + local_12c0);
      auVar52 = vpmovzxbd_avx(auVar129);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar54 = vfmadd213ps_fma(auVar52,auVar115,auVar104);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = *(ulong *)(local_1320 + 0x20 + local_12c0);
      auVar52 = vpmovzxbd_avx(auVar132);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar119 = vfmadd213ps_fma(auVar52,auVar115,auVar104);
      uVar7 = *(undefined4 *)(uVar49 + 0x40 + lVar32);
      auVar105._4_4_ = uVar7;
      auVar105._0_4_ = uVar7;
      auVar105._8_4_ = uVar7;
      auVar105._12_4_ = uVar7;
      uVar7 = *(undefined4 *)(uVar49 + 0x4c + lVar32);
      auVar116._4_4_ = uVar7;
      auVar116._0_4_ = uVar7;
      auVar116._8_4_ = uVar7;
      auVar116._12_4_ = uVar7;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = *(ulong *)(local_1328 + 0x20 + local_12c0);
      auVar52 = vpmovzxbd_avx(auVar135);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar124 = vfmadd213ps_fma(auVar52,auVar116,auVar105);
      auVar137._8_8_ = 0;
      auVar137._0_8_ = *(ulong *)(local_1330 + 0x20 + local_12c0);
      auVar52 = vpmovzxbd_avx(auVar137);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar63 = vfmadd213ps_fma(auVar52,auVar116,auVar105);
      auVar52 = vsubps_avx(auVar56,auVar139._0_16_);
      auVar106._0_4_ = auVar136._0_4_ * auVar52._0_4_;
      auVar106._4_4_ = auVar136._4_4_ * auVar52._4_4_;
      auVar106._8_4_ = auVar136._8_4_ * auVar52._8_4_;
      auVar106._12_4_ = auVar136._12_4_ * auVar52._12_4_;
      auVar52 = vsubps_avx(auVar54,auVar141._0_16_);
      auVar117._0_4_ = auVar140._0_4_ * auVar52._0_4_;
      auVar117._4_4_ = auVar140._4_4_ * auVar52._4_4_;
      auVar117._8_4_ = auVar140._8_4_ * auVar52._8_4_;
      auVar117._12_4_ = auVar140._12_4_ * auVar52._12_4_;
      auVar52 = vmaxps_avx(auVar106,auVar117);
      auVar56 = vsubps_avx(auVar124,auVar144._0_16_);
      auVar118._0_4_ = auVar133._0_4_ * auVar56._0_4_;
      auVar118._4_4_ = auVar133._4_4_ * auVar56._4_4_;
      auVar118._8_4_ = auVar133._8_4_ * auVar56._8_4_;
      auVar118._12_4_ = auVar133._12_4_ * auVar56._12_4_;
      auVar56 = vsubps_avx(auVar53,auVar139._0_16_);
      auVar122._0_4_ = fVar123 * auVar56._0_4_;
      auVar122._4_4_ = fVar96 * auVar56._4_4_;
      auVar122._8_4_ = fVar97 * auVar56._8_4_;
      auVar122._12_4_ = fVar98 * auVar56._12_4_;
      auVar56 = vsubps_avx(auVar119,auVar141._0_16_);
      auVar126._0_4_ = fVar51 * auVar56._0_4_;
      auVar126._4_4_ = fVar99 * auVar56._4_4_;
      auVar126._8_4_ = fVar100 * auVar56._8_4_;
      auVar126._12_4_ = fVar101 * auVar56._12_4_;
      auVar56 = vminps_avx(auVar122,auVar126);
      auVar53 = vsubps_avx(auVar63,auVar144._0_16_);
      auVar53 = vmulps_avx512vl(auVar146._0_16_,auVar53);
      auVar54 = vmaxps_avx512vl(auVar118,auVar147._0_16_);
      local_1190 = vmaxps_avx(auVar52,auVar54);
      auVar52 = vminps_avx512vl(auVar53,auVar148._0_16_);
      auVar52 = vminps_avx(auVar56,auVar52);
      uVar23 = vcmpps_avx512vl(local_1190,auVar52,2);
      local_12b8 = CONCAT44((int)(local_1320 >> 0x20),(uint)(byte)((byte)uVar24 & (byte)uVar23));
      while (local_12b8 != 0) {
        lVar32 = 0;
        for (uVar50 = local_12b8; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        local_12b8 = local_12b8 - 1 & local_12b8;
        fVar8 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)(local_1190 + lVar32 * 4) <= fVar8) {
          uVar11 = *(ushort *)(local_12c0 + lVar32 * 8);
          uVar12 = *(ushort *)(local_12c0 + 2 + lVar32 * 8);
          uVar34 = *(uint *)(local_12c0 + 0x50);
          uVar36 = *(uint *)(local_12c0 + 4 + lVar32 * 8);
          pGVar13 = (context->scene->geometries).items[uVar34].ptr;
          lVar32 = *(long *)&pGVar13->field_0x58;
          lVar41 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   (ulong)uVar36;
          uVar35 = *(uint *)(lVar32 + 4 + lVar41);
          uVar42 = (ulong)uVar35;
          uVar43 = (ulong)(uVar35 * (uVar12 & 0x7fff) +
                          *(int *)(lVar32 + lVar41) + (uVar11 & 0x7fff));
          lVar14 = *(long *)&pGVar13[1].time_range.upper;
          p_Var15 = pGVar13[1].intersectionFilterN;
          auVar52 = *(undefined1 (*) [16])(lVar14 + (uVar43 + 1) * (long)p_Var15);
          auVar56 = *(undefined1 (*) [16])(lVar14 + (uVar42 + uVar43) * (long)p_Var15);
          lVar33 = uVar42 + uVar43 + 1;
          auVar53 = *(undefined1 (*) [16])(lVar14 + lVar33 * (long)p_Var15);
          uVar39 = (ulong)(-1 < (short)uVar11);
          auVar54 = *(undefined1 (*) [16])(lVar14 + (uVar39 + uVar43 + 1) * (long)p_Var15);
          lVar38 = uVar39 + lVar33;
          auVar119 = *(undefined1 (*) [16])(lVar14 + lVar38 * (long)p_Var15);
          uVar39 = 0;
          if (-1 < (short)uVar12) {
            uVar39 = uVar42;
          }
          auVar124 = *(undefined1 (*) [16])(lVar14 + (uVar42 + uVar43 + uVar39) * (long)p_Var15);
          auVar63 = *(undefined1 (*) [16])(lVar14 + (lVar33 + uVar39) * (long)p_Var15);
          auVar81._16_16_ = *(undefined1 (*) [16])(lVar14 + (uVar39 + lVar38) * (long)p_Var15);
          auVar81._0_16_ = auVar53;
          auVar112 = vunpcklps_avx(auVar52,auVar119);
          auVar111 = vunpckhps_avx(auVar52,auVar119);
          auVar61 = vunpcklps_avx(auVar54,auVar53);
          auVar54 = vunpckhps_avx(auVar54,auVar53);
          auVar62 = vunpcklps_avx(auVar111,auVar54);
          auVar64 = vunpcklps_avx(auVar112,auVar61);
          auVar54 = vunpckhps_avx(auVar112,auVar61);
          auVar112 = vunpcklps_avx(auVar56,auVar63);
          auVar111 = vunpckhps_avx(auVar56,auVar63);
          auVar61 = vunpcklps_avx(auVar53,auVar124);
          auVar124 = vunpckhps_avx(auVar53,auVar124);
          auVar111 = vunpcklps_avx(auVar111,auVar124);
          auVar65 = vunpcklps_avx(auVar112,auVar61);
          auVar124 = vunpckhps_avx(auVar112,auVar61);
          auVar78._16_16_ = auVar63;
          auVar78._0_16_ = auVar56;
          auVar72._16_16_ = auVar119;
          auVar72._0_16_ = auVar52;
          auVar93 = vunpcklps_avx(auVar72,auVar78);
          auVar71._16_16_ = auVar53;
          auVar71._0_16_ = *(undefined1 (*) [16])(lVar14 + (long)p_Var15 * uVar43);
          auVar90 = vunpcklps_avx(auVar71,auVar81);
          auVar74 = vunpcklps_avx(auVar90,auVar93);
          auVar90 = vunpckhps_avx(auVar90,auVar93);
          auVar93 = vunpckhps_avx(auVar72,auVar78);
          auVar73 = vunpckhps_avx(auVar71,auVar81);
          auVar73 = vunpcklps_avx(auVar73,auVar93);
          auVar77._16_16_ = auVar64;
          auVar77._0_16_ = auVar64;
          auVar79._16_16_ = auVar54;
          auVar79._0_16_ = auVar54;
          auVar80._16_16_ = auVar62;
          auVar80._0_16_ = auVar62;
          auVar82._16_16_ = auVar65;
          auVar82._0_16_ = auVar65;
          auVar84._16_16_ = auVar124;
          auVar84._0_16_ = auVar124;
          uVar7 = *(undefined4 *)(ray + local_1378 * 4);
          auVar85._4_4_ = uVar7;
          auVar85._0_4_ = uVar7;
          auVar85._8_4_ = uVar7;
          auVar85._12_4_ = uVar7;
          auVar85._16_4_ = uVar7;
          auVar85._20_4_ = uVar7;
          auVar85._24_4_ = uVar7;
          auVar85._28_4_ = uVar7;
          auVar69 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + local_1378 * 4 + 0x10)));
          auVar70 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + local_1378 * 4 + 0x20)));
          uVar7 = *(undefined4 *)(ray + local_1378 * 4 + 0x40);
          auVar138._4_4_ = uVar7;
          auVar138._0_4_ = uVar7;
          auVar138._8_4_ = uVar7;
          auVar138._12_4_ = uVar7;
          auVar138._16_4_ = uVar7;
          auVar138._20_4_ = uVar7;
          auVar138._24_4_ = uVar7;
          auVar138._28_4_ = uVar7;
          auVar83._16_16_ = auVar111;
          auVar83._0_16_ = auVar111;
          uVar7 = *(undefined4 *)(ray + local_1378 * 4 + 0x50);
          auVar142._4_4_ = uVar7;
          auVar142._0_4_ = uVar7;
          auVar142._8_4_ = uVar7;
          auVar142._12_4_ = uVar7;
          auVar142._16_4_ = uVar7;
          auVar142._20_4_ = uVar7;
          auVar142._24_4_ = uVar7;
          auVar142._28_4_ = uVar7;
          fVar123 = *(float *)(ray + local_1378 * 4 + 0x60);
          auVar145._4_4_ = fVar123;
          auVar145._0_4_ = fVar123;
          auVar145._8_4_ = fVar123;
          auVar145._12_4_ = fVar123;
          auVar145._16_4_ = fVar123;
          auVar145._20_4_ = fVar123;
          auVar145._24_4_ = fVar123;
          auVar145._28_4_ = fVar123;
          auVar93 = vsubps_avx(auVar74,auVar85);
          auVar71 = vsubps_avx512vl(auVar90,auVar69);
          auVar72 = vsubps_avx512vl(auVar73,auVar70);
          auVar90 = vsubps_avx(auVar77,auVar85);
          auVar73 = vsubps_avx512vl(auVar79,auVar69);
          auVar74 = vsubps_avx512vl(auVar80,auVar70);
          auVar75 = vsubps_avx512vl(auVar82,auVar85);
          auVar76 = vsubps_avx512vl(auVar84,auVar69);
          auVar70 = vsubps_avx512vl(auVar83,auVar70);
          auVar77 = vsubps_avx512vl(auVar75,auVar93);
          auVar78 = vsubps_avx512vl(auVar76,auVar71);
          auVar79 = vsubps_avx512vl(auVar70,auVar72);
          auVar80 = vsubps_avx512vl(auVar93,auVar90);
          auVar81 = vsubps_avx512vl(auVar71,auVar73);
          auVar82 = vsubps_avx512vl(auVar72,auVar74);
          auVar83 = vsubps_avx512vl(auVar90,auVar75);
          auVar84 = vsubps_avx512vl(auVar73,auVar76);
          auVar85 = vsubps_avx512vl(auVar74,auVar70);
          auVar69 = vaddps_avx512vl(auVar75,auVar93);
          auVar86 = vaddps_avx512vl(auVar76,auVar71);
          auVar87 = vaddps_avx512vl(auVar70,auVar72);
          auVar88 = vmulps_avx512vl(auVar86,auVar79);
          auVar88 = vfmsub231ps_avx512vl(auVar88,auVar78,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar77);
          auVar87 = vfmsub231ps_avx512vl(auVar87,auVar79,auVar69);
          auVar69 = vmulps_avx512vl(auVar69,auVar78);
          auVar52 = vfmsub231ps_fma(auVar69,auVar77,auVar86);
          auVar86._0_4_ = auVar52._0_4_ * fVar123;
          auVar86._4_4_ = auVar52._4_4_ * fVar123;
          auVar86._8_4_ = auVar52._8_4_ * fVar123;
          auVar86._12_4_ = auVar52._12_4_ * fVar123;
          auVar86._16_4_ = fVar123 * 0.0;
          auVar86._20_4_ = fVar123 * 0.0;
          auVar86._24_4_ = fVar123 * 0.0;
          auVar86._28_4_ = 0;
          auVar69 = vfmadd231ps_avx512vl(auVar86,auVar142,auVar87);
          auVar86 = vfmadd231ps_avx512vl(auVar69,auVar138,auVar88);
          auVar89._0_4_ = auVar93._0_4_ + auVar90._0_4_;
          auVar89._4_4_ = auVar93._4_4_ + auVar90._4_4_;
          auVar89._8_4_ = auVar93._8_4_ + auVar90._8_4_;
          auVar89._12_4_ = auVar93._12_4_ + auVar90._12_4_;
          auVar89._16_4_ = auVar93._16_4_ + auVar90._16_4_;
          auVar89._20_4_ = auVar93._20_4_ + auVar90._20_4_;
          auVar89._24_4_ = auVar93._24_4_ + auVar90._24_4_;
          auVar89._28_4_ = auVar93._28_4_ + auVar90._28_4_;
          auVar69 = vaddps_avx512vl(auVar71,auVar73);
          auVar87 = vaddps_avx512vl(auVar72,auVar74);
          auVar88 = vmulps_avx512vl(auVar69,auVar82);
          auVar88 = vfmsub231ps_avx512vl(auVar88,auVar81,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar80);
          auVar87 = vfmsub231ps_avx512vl(auVar87,auVar82,auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar81);
          auVar89 = vfmsub231ps_avx512vl(auVar89,auVar80,auVar69);
          auVar69._4_4_ = auVar89._4_4_ * fVar123;
          auVar69._0_4_ = auVar89._0_4_ * fVar123;
          auVar69._8_4_ = auVar89._8_4_ * fVar123;
          auVar69._12_4_ = auVar89._12_4_ * fVar123;
          auVar69._16_4_ = auVar89._16_4_ * fVar123;
          auVar69._20_4_ = auVar89._20_4_ * fVar123;
          auVar69._24_4_ = auVar89._24_4_ * fVar123;
          auVar69._28_4_ = auVar89._28_4_;
          auVar69 = vfmadd231ps_avx512vl(auVar69,auVar142,auVar87);
          auVar69 = vfmadd231ps_avx512vl(auVar69,auVar138,auVar88);
          auVar90 = vaddps_avx512vl(auVar90,auVar75);
          auVar73 = vaddps_avx512vl(auVar73,auVar76);
          auVar74 = vaddps_avx512vl(auVar74,auVar70);
          auVar70 = vmulps_avx512vl(auVar73,auVar85);
          auVar76 = vfmsub231ps_avx512vl(auVar70,auVar84,auVar74);
          auVar70._4_4_ = auVar74._4_4_ * auVar83._4_4_;
          auVar70._0_4_ = auVar74._0_4_ * auVar83._0_4_;
          auVar70._8_4_ = auVar74._8_4_ * auVar83._8_4_;
          auVar70._12_4_ = auVar74._12_4_ * auVar83._12_4_;
          auVar70._16_4_ = auVar74._16_4_ * auVar83._16_4_;
          auVar70._20_4_ = auVar74._20_4_ * auVar83._20_4_;
          auVar70._24_4_ = auVar74._24_4_ * auVar83._24_4_;
          auVar70._28_4_ = auVar74._28_4_;
          auVar52 = vfmsub231ps_fma(auVar70,auVar85,auVar90);
          auVar75._4_4_ = auVar90._4_4_ * auVar84._4_4_;
          auVar75._0_4_ = auVar90._0_4_ * auVar84._0_4_;
          auVar75._8_4_ = auVar90._8_4_ * auVar84._8_4_;
          auVar75._12_4_ = auVar90._12_4_ * auVar84._12_4_;
          auVar75._16_4_ = auVar90._16_4_ * auVar84._16_4_;
          auVar75._20_4_ = auVar90._20_4_ * auVar84._20_4_;
          auVar75._24_4_ = auVar90._24_4_ * auVar84._24_4_;
          auVar75._28_4_ = auVar90._28_4_;
          auVar90 = vfmsub231ps_avx512vl(auVar75,auVar83,auVar73);
          auVar90 = vmulps_avx512vl(auVar90,auVar145);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar142,ZEXT1632(auVar52));
          auVar70 = vfmadd231ps_avx512vl(auVar90,auVar138,auVar76);
          auVar76._0_4_ = auVar86._0_4_ + auVar69._0_4_;
          auVar76._4_4_ = auVar86._4_4_ + auVar69._4_4_;
          auVar76._8_4_ = auVar86._8_4_ + auVar69._8_4_;
          auVar76._12_4_ = auVar86._12_4_ + auVar69._12_4_;
          auVar76._16_4_ = auVar86._16_4_ + auVar69._16_4_;
          auVar76._20_4_ = auVar86._20_4_ + auVar69._20_4_;
          auVar76._24_4_ = auVar86._24_4_ + auVar69._24_4_;
          auVar76._28_4_ = auVar86._28_4_ + auVar69._28_4_;
          local_1140 = vaddps_avx512vl(auVar70,auVar76);
          auVar90._8_4_ = 0x7fffffff;
          auVar90._0_8_ = 0x7fffffff7fffffff;
          auVar90._12_4_ = 0x7fffffff;
          auVar90._16_4_ = 0x7fffffff;
          auVar90._20_4_ = 0x7fffffff;
          auVar90._24_4_ = 0x7fffffff;
          auVar90._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_1140,auVar90);
          auVar73._8_4_ = 0x34000000;
          auVar73._0_8_ = 0x3400000034000000;
          auVar73._12_4_ = 0x34000000;
          auVar73._16_4_ = 0x34000000;
          auVar73._20_4_ = 0x34000000;
          auVar73._24_4_ = 0x34000000;
          auVar73._28_4_ = 0x34000000;
          auVar90 = vmulps_avx512vl(local_1140,auVar73);
          auVar73 = vminps_avx512vl(auVar86,auVar69);
          auVar73 = vminps_avx512vl(auVar73,auVar70);
          auVar74._8_4_ = 0x80000000;
          auVar74._0_8_ = 0x8000000080000000;
          auVar74._12_4_ = 0x80000000;
          auVar74._16_4_ = 0x80000000;
          auVar74._20_4_ = 0x80000000;
          auVar74._24_4_ = 0x80000000;
          auVar74._28_4_ = 0x80000000;
          auVar74 = vxorps_avx512vl(auVar90,auVar74);
          uVar23 = vcmpps_avx512vl(auVar73,auVar74,5);
          auVar73 = vmaxps_avx512vl(auVar86,auVar69);
          auVar73 = vmaxps_avx512vl(auVar73,auVar70);
          uVar24 = vcmpps_avx512vl(auVar73,auVar90,2);
          bVar48 = (byte)uVar23 | (byte)uVar24;
          k = local_1378;
          if (bVar48 != 0) {
            auVar90 = vmulps_avx512vl(auVar81,auVar79);
            auVar73 = vmulps_avx512vl(auVar77,auVar82);
            auVar74 = vmulps_avx512vl(auVar80,auVar78);
            auVar70 = vmulps_avx512vl(auVar84,auVar82);
            auVar75 = vmulps_avx512vl(auVar80,auVar85);
            auVar76 = vmulps_avx512vl(auVar83,auVar81);
            auVar78 = vfmsub213ps_avx512vl(auVar78,auVar82,auVar90);
            auVar79 = vfmsub213ps_avx512vl(auVar79,auVar80,auVar73);
            auVar77 = vfmsub213ps_avx512vl(auVar77,auVar81,auVar74);
            auVar81 = vfmsub213ps_avx512vl(auVar85,auVar81,auVar70);
            auVar82 = vfmsub213ps_avx512vl(auVar83,auVar82,auVar75);
            auVar80 = vfmsub213ps_avx512vl(auVar84,auVar80,auVar76);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar90,auVar83);
            vandps_avx512vl(auVar70,auVar83);
            uVar39 = vcmpps_avx512vl(auVar83,auVar83,1);
            vandps_avx512vl(auVar73,auVar83);
            vandps_avx512vl(auVar75,auVar83);
            uVar42 = vcmpps_avx512vl(auVar83,auVar83,1);
            vandps_avx512vl(auVar74,auVar83);
            vandps_avx512vl(auVar76,auVar83);
            uVar43 = vcmpps_avx512vl(auVar83,auVar83,1);
            bVar16 = (bool)((byte)uVar39 & 1);
            auVar91._0_4_ = (float)((uint)bVar16 * auVar78._0_4_ | (uint)!bVar16 * auVar81._0_4_);
            bVar16 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar91._4_4_ = (float)((uint)bVar16 * auVar78._4_4_ | (uint)!bVar16 * auVar81._4_4_);
            bVar16 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar91._8_4_ = (float)((uint)bVar16 * auVar78._8_4_ | (uint)!bVar16 * auVar81._8_4_);
            bVar16 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar91._12_4_ = (float)((uint)bVar16 * auVar78._12_4_ | (uint)!bVar16 * auVar81._12_4_)
            ;
            bVar16 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar91._16_4_ = (float)((uint)bVar16 * auVar78._16_4_ | (uint)!bVar16 * auVar81._16_4_)
            ;
            bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar91._20_4_ = (float)((uint)bVar16 * auVar78._20_4_ | (uint)!bVar16 * auVar81._20_4_)
            ;
            bVar16 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar91._24_4_ = (float)((uint)bVar16 * auVar78._24_4_ | (uint)!bVar16 * auVar81._24_4_)
            ;
            bVar16 = SUB81(uVar39 >> 7,0);
            auVar91._28_4_ = (uint)bVar16 * auVar78._28_4_ | (uint)!bVar16 * auVar81._28_4_;
            bVar16 = (bool)((byte)uVar42 & 1);
            auVar92._0_4_ = (float)((uint)bVar16 * auVar79._0_4_ | (uint)!bVar16 * auVar82._0_4_);
            bVar16 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar92._4_4_ = (float)((uint)bVar16 * auVar79._4_4_ | (uint)!bVar16 * auVar82._4_4_);
            bVar16 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar92._8_4_ = (float)((uint)bVar16 * auVar79._8_4_ | (uint)!bVar16 * auVar82._8_4_);
            bVar16 = (bool)((byte)(uVar42 >> 3) & 1);
            auVar92._12_4_ = (float)((uint)bVar16 * auVar79._12_4_ | (uint)!bVar16 * auVar82._12_4_)
            ;
            bVar16 = (bool)((byte)(uVar42 >> 4) & 1);
            auVar92._16_4_ = (float)((uint)bVar16 * auVar79._16_4_ | (uint)!bVar16 * auVar82._16_4_)
            ;
            bVar16 = (bool)((byte)(uVar42 >> 5) & 1);
            auVar92._20_4_ = (float)((uint)bVar16 * auVar79._20_4_ | (uint)!bVar16 * auVar82._20_4_)
            ;
            bVar16 = (bool)((byte)(uVar42 >> 6) & 1);
            auVar92._24_4_ = (float)((uint)bVar16 * auVar79._24_4_ | (uint)!bVar16 * auVar82._24_4_)
            ;
            bVar16 = SUB81(uVar42 >> 7,0);
            auVar92._28_4_ = (uint)bVar16 * auVar79._28_4_ | (uint)!bVar16 * auVar82._28_4_;
            bVar16 = (bool)((byte)uVar43 & 1);
            fVar51 = (float)((uint)bVar16 * auVar77._0_4_ | (uint)!bVar16 * auVar80._0_4_);
            bVar16 = (bool)((byte)(uVar43 >> 1) & 1);
            fVar96 = (float)((uint)bVar16 * auVar77._4_4_ | (uint)!bVar16 * auVar80._4_4_);
            bVar16 = (bool)((byte)(uVar43 >> 2) & 1);
            fVar97 = (float)((uint)bVar16 * auVar77._8_4_ | (uint)!bVar16 * auVar80._8_4_);
            bVar16 = (bool)((byte)(uVar43 >> 3) & 1);
            fVar98 = (float)((uint)bVar16 * auVar77._12_4_ | (uint)!bVar16 * auVar80._12_4_);
            bVar16 = (bool)((byte)(uVar43 >> 4) & 1);
            fVar99 = (float)((uint)bVar16 * auVar77._16_4_ | (uint)!bVar16 * auVar80._16_4_);
            bVar16 = (bool)((byte)(uVar43 >> 5) & 1);
            fVar100 = (float)((uint)bVar16 * auVar77._20_4_ | (uint)!bVar16 * auVar80._20_4_);
            bVar16 = (bool)((byte)(uVar43 >> 6) & 1);
            fVar101 = (float)((uint)bVar16 * auVar77._24_4_ | (uint)!bVar16 * auVar80._24_4_);
            bVar16 = SUB81(uVar43 >> 7,0);
            auVar88._4_4_ = fVar123 * fVar96;
            auVar88._0_4_ = fVar123 * fVar51;
            auVar88._8_4_ = fVar123 * fVar97;
            auVar88._12_4_ = fVar123 * fVar98;
            auVar88._16_4_ = fVar123 * fVar99;
            auVar88._20_4_ = fVar123 * fVar100;
            auVar88._24_4_ = fVar123 * fVar101;
            auVar88._28_4_ = fVar123;
            auVar52 = vfmadd213ps_fma(auVar142,auVar92,auVar88);
            auVar52 = vfmadd213ps_fma(auVar138,auVar91,ZEXT1632(auVar52));
            auVar73 = ZEXT1632(CONCAT412(auVar52._12_4_ + auVar52._12_4_,
                                         CONCAT48(auVar52._8_4_ + auVar52._8_4_,
                                                  CONCAT44(auVar52._4_4_ + auVar52._4_4_,
                                                           auVar52._0_4_ + auVar52._0_4_))));
            auVar143._0_4_ = auVar72._0_4_ * fVar51;
            auVar143._4_4_ = auVar72._4_4_ * fVar96;
            auVar143._8_4_ = auVar72._8_4_ * fVar97;
            auVar143._12_4_ = auVar72._12_4_ * fVar98;
            auVar143._16_4_ = auVar72._16_4_ * fVar99;
            auVar143._20_4_ = auVar72._20_4_ * fVar100;
            auVar143._24_4_ = auVar72._24_4_ * fVar101;
            auVar143._28_4_ = 0;
            auVar52 = vfmadd213ps_fma(auVar71,auVar92,auVar143);
            auVar56 = vfmadd213ps_fma(auVar93,auVar91,ZEXT1632(auVar52));
            auVar90 = vrcp14ps_avx512vl(auVar73);
            auVar93._8_4_ = 0x3f800000;
            auVar93._0_8_ = 0x3f8000003f800000;
            auVar93._12_4_ = 0x3f800000;
            auVar93._16_4_ = 0x3f800000;
            auVar93._20_4_ = 0x3f800000;
            auVar93._24_4_ = 0x3f800000;
            auVar93._28_4_ = 0x3f800000;
            auVar93 = vfnmadd213ps_avx512vl(auVar90,auVar73,auVar93);
            auVar52 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
            local_1280._28_4_ = auVar90._28_4_;
            local_1280._0_28_ =
                 ZEXT1628(CONCAT412(auVar52._12_4_ * (auVar56._12_4_ + auVar56._12_4_),
                                    CONCAT48(auVar52._8_4_ * (auVar56._8_4_ + auVar56._8_4_),
                                             CONCAT44(auVar52._4_4_ *
                                                      (auVar56._4_4_ + auVar56._4_4_),
                                                      auVar52._0_4_ *
                                                      (auVar56._0_4_ + auVar56._0_4_)))));
            auVar133 = ZEXT3264(local_1280);
            auVar107._4_4_ = fVar8;
            auVar107._0_4_ = fVar8;
            auVar107._8_4_ = fVar8;
            auVar107._12_4_ = fVar8;
            auVar107._16_4_ = fVar8;
            auVar107._20_4_ = fVar8;
            auVar107._24_4_ = fVar8;
            auVar107._28_4_ = fVar8;
            uVar23 = vcmpps_avx512vl(local_1280,auVar107,2);
            uVar7 = *(undefined4 *)(ray + local_1378 * 4 + 0x30);
            auVar87._4_4_ = uVar7;
            auVar87._0_4_ = uVar7;
            auVar87._8_4_ = uVar7;
            auVar87._12_4_ = uVar7;
            auVar87._16_4_ = uVar7;
            auVar87._20_4_ = uVar7;
            auVar87._24_4_ = uVar7;
            auVar87._28_4_ = uVar7;
            uVar24 = vcmpps_avx512vl(local_1280,auVar87,0xd);
            bVar48 = (byte)uVar23 & (byte)uVar24 & bVar48;
            if (bVar48 != 0) {
              uVar39 = vcmpps_avx512vl(auVar73,_DAT_01f7b000,4);
              uVar39 = bVar48 & uVar39;
              local_1118 = (byte)uVar39;
              if (local_1118 != 0) {
                local_1120 = &local_1381;
                local_10c0 = local_1280;
                auVar93 = vsubps_avx(local_1140,auVar69);
                auVar93 = vblendps_avx(auVar86,auVar93,0xf0);
                auVar90 = vsubps_avx(local_1140,auVar86);
                local_1160 = vblendps_avx(auVar69,auVar90,0xf0);
                local_10a0[0] = auVar91._0_4_ * 1.0;
                local_10a0[1] = auVar91._4_4_ * 1.0;
                local_10a0[2] = auVar91._8_4_ * 1.0;
                local_10a0[3] = auVar91._12_4_ * 1.0;
                fStack_1090 = auVar91._16_4_ * -1.0;
                fStack_108c = auVar91._20_4_ * -1.0;
                fStack_1088 = auVar91._24_4_ * -1.0;
                uStack_1084 = auVar91._28_4_;
                local_1080[0] = auVar92._0_4_ * 1.0;
                local_1080[1] = auVar92._4_4_ * 1.0;
                local_1080[2] = auVar92._8_4_ * 1.0;
                local_1080[3] = auVar92._12_4_ * 1.0;
                fStack_1070 = auVar92._16_4_ * -1.0;
                fStack_106c = auVar92._20_4_ * -1.0;
                fStack_1068 = auVar92._24_4_ * -1.0;
                uStack_1064 = auVar92._28_4_;
                local_1060._4_4_ = fVar96 * 1.0;
                local_1060._0_4_ = fVar51 * 1.0;
                local_1060._8_4_ = fVar97 * 1.0;
                local_1060._12_4_ = fVar98 * 1.0;
                local_1060._16_4_ = fVar99 * -1.0;
                local_1060._20_4_ = fVar100 * -1.0;
                local_1060._24_4_ = fVar101 * -1.0;
                local_1060._28_4_ = (uint)bVar16 * auVar77._28_4_ | (uint)!bVar16 * auVar80._28_4_;
                auVar90 = vpbroadcastd_avx512vl();
                auVar90 = vpaddd_avx2(auVar90,_DAT_01fb7740);
                auVar127._0_4_ = (float)(int)(*(ushort *)(lVar32 + 8 + lVar41) - 1);
                auVar127._4_12_ = auVar72._4_12_;
                auVar130._4_12_ = ZEXT812(0) << 0x20;
                auVar130._0_4_ = auVar127._0_4_;
                auVar56 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar130);
                auVar52 = vfnmadd213ss_fma(auVar56,auVar127,ZEXT416(0x40000000));
                fVar123 = auVar56._0_4_ * auVar52._0_4_;
                auVar90 = vcvtdq2ps_avx(auVar90);
                fVar101 = auVar90._28_4_ + auVar93._28_4_;
                fVar51 = (local_1140._0_4_ * auVar90._0_4_ + auVar93._0_4_) * fVar123;
                fVar96 = (local_1140._4_4_ * auVar90._4_4_ + auVar93._4_4_) * fVar123;
                local_1180._4_4_ = fVar96;
                local_1180._0_4_ = fVar51;
                fVar97 = (local_1140._8_4_ * auVar90._8_4_ + auVar93._8_4_) * fVar123;
                local_1180._8_4_ = fVar97;
                fVar98 = (local_1140._12_4_ * auVar90._12_4_ + auVar93._12_4_) * fVar123;
                local_1180._12_4_ = fVar98;
                fVar99 = (local_1140._16_4_ * auVar90._16_4_ + auVar93._16_4_) * fVar123;
                local_1180._16_4_ = fVar99;
                fVar100 = (local_1140._20_4_ * auVar90._20_4_ + auVar93._20_4_) * fVar123;
                local_1180._20_4_ = fVar100;
                fVar123 = (local_1140._24_4_ * auVar90._24_4_ + auVar93._24_4_) * fVar123;
                local_1180._24_4_ = fVar123;
                local_1180._28_4_ = fVar101;
                pGVar13 = (context->scene->geometries).items[uVar34].ptr;
                if ((pGVar13->mask & *(uint *)(ray + local_1378 * 4 + 0x90)) != 0) {
                  auVar93 = vpbroadcastd_avx512vl();
                  auVar93 = vpaddd_avx2(auVar93,_DAT_01fb7760);
                  auVar93 = vcvtdq2ps_avx(auVar93);
                  auVar128._0_4_ = (float)(int)(*(ushort *)(lVar32 + 10 + lVar41) - 1);
                  auVar128._4_12_ = auVar86._4_12_;
                  auVar29._12_4_ = 0;
                  auVar29._0_12_ = ZEXT812(0);
                  auVar56 = vrcp14ss_avx512f(auVar29 << 0x20,ZEXT416((uint)auVar128._0_4_));
                  auVar52 = vfnmadd213ss_fma(auVar56,auVar128,ZEXT416(0x40000000));
                  fVar22 = auVar56._0_4_ * auVar52._0_4_;
                  auVar26._8_4_ = 0x219392ef;
                  auVar26._0_8_ = 0x219392ef219392ef;
                  auVar26._12_4_ = 0x219392ef;
                  auVar26._16_4_ = 0x219392ef;
                  auVar26._20_4_ = 0x219392ef;
                  auVar26._24_4_ = 0x219392ef;
                  auVar26._28_4_ = 0x219392ef;
                  uVar42 = vcmpps_avx512vl(local_1140,auVar26,5);
                  auVar90 = vrcp14ps_avx512vl(local_1140);
                  auVar131._8_4_ = 0x3f800000;
                  auVar131._0_8_ = 0x3f8000003f800000;
                  auVar131._12_4_ = 0x3f800000;
                  auVar131._16_4_ = 0x3f800000;
                  auVar131._20_4_ = 0x3f800000;
                  auVar131._24_4_ = 0x3f800000;
                  auVar131._28_4_ = 0x3f800000;
                  auVar52 = vfnmadd213ps_fma(local_1140,auVar90,auVar131);
                  auVar90 = vfmadd132ps_avx512vl(ZEXT1632(auVar52),auVar90,auVar90);
                  fVar1 = (float)((uint)((byte)uVar42 & 1) * auVar90._0_4_);
                  fVar8 = (float)((uint)((byte)(uVar42 >> 1) & 1) * auVar90._4_4_);
                  fVar2 = (float)((uint)((byte)(uVar42 >> 2) & 1) * auVar90._8_4_);
                  fVar3 = (float)((uint)((byte)(uVar42 >> 3) & 1) * auVar90._12_4_);
                  fVar4 = (float)((uint)((byte)(uVar42 >> 4) & 1) * auVar90._16_4_);
                  fVar5 = (float)((uint)((byte)(uVar42 >> 5) & 1) * auVar90._20_4_);
                  fVar6 = (float)((uint)((byte)(uVar42 >> 6) & 1) * auVar90._24_4_);
                  auVar27._4_4_ = fVar96 * fVar8;
                  auVar27._0_4_ = fVar51 * fVar1;
                  auVar27._8_4_ = fVar97 * fVar2;
                  auVar27._12_4_ = fVar98 * fVar3;
                  auVar27._16_4_ = fVar99 * fVar4;
                  auVar27._20_4_ = fVar100 * fVar5;
                  auVar27._24_4_ = fVar123 * fVar6;
                  auVar27._28_4_ = fVar101;
                  local_1100 = vminps_avx(auVar27,auVar131);
                  auVar28._4_4_ =
                       (local_1140._4_4_ * auVar93._4_4_ + local_1160._4_4_) * fVar22 * fVar8;
                  auVar28._0_4_ =
                       (local_1140._0_4_ * auVar93._0_4_ + local_1160._0_4_) * fVar22 * fVar1;
                  auVar28._8_4_ =
                       (local_1140._8_4_ * auVar93._8_4_ + local_1160._8_4_) * fVar22 * fVar2;
                  auVar28._12_4_ =
                       (local_1140._12_4_ * auVar93._12_4_ + local_1160._12_4_) * fVar22 * fVar3;
                  auVar28._16_4_ =
                       (local_1140._16_4_ * auVar93._16_4_ + local_1160._16_4_) * fVar22 * fVar4;
                  auVar28._20_4_ =
                       (local_1140._20_4_ * auVar93._20_4_ + local_1160._20_4_) * fVar22 * fVar5;
                  auVar28._24_4_ =
                       (local_1140._24_4_ * auVar93._24_4_ + local_1160._24_4_) * fVar22 * fVar6;
                  auVar28._28_4_ = auVar93._28_4_ + local_1160._28_4_;
                  local_10e0 = vminps_avx(auVar28,auVar131);
                  auVar108._8_4_ = 0x7f800000;
                  auVar108._0_8_ = 0x7f8000007f800000;
                  auVar108._12_4_ = 0x7f800000;
                  auVar108._16_4_ = 0x7f800000;
                  auVar108._20_4_ = 0x7f800000;
                  auVar108._24_4_ = 0x7f800000;
                  auVar108._28_4_ = 0x7f800000;
                  auVar93 = vblendmps_avx512vl(auVar108,local_1280);
                  auVar94._0_4_ =
                       (uint)(local_1118 & 1) * auVar93._0_4_ |
                       (uint)!(bool)(local_1118 & 1) * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar94._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar94._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar39 >> 3) & 1);
                  auVar94._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar39 >> 4) & 1);
                  auVar94._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
                  auVar94._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)((byte)(uVar39 >> 6) & 1);
                  auVar94._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = SUB81(uVar39 >> 7,0);
                  auVar94._28_4_ = (uint)bVar16 * auVar93._28_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar93 = vshufps_avx(auVar94,auVar94,0xb1);
                  auVar93 = vminps_avx(auVar94,auVar93);
                  auVar90 = vshufpd_avx(auVar93,auVar93,5);
                  auVar93 = vminps_avx(auVar93,auVar90);
                  auVar90 = vpermpd_avx2(auVar93,0x4e);
                  auVar93 = vminps_avx(auVar93,auVar90);
                  uVar23 = vcmpps_avx512vl(auVar94,auVar93,0);
                  uVar35 = (uint)uVar39;
                  if ((local_1118 & (byte)uVar23) != 0) {
                    uVar35 = (uint)(local_1118 & (byte)uVar23);
                  }
                  uVar25 = 0;
                  for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
                    uVar25 = uVar25 + 1;
                  }
                  uVar42 = (ulong)uVar25;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_1350 = vpbroadcastd_avx512vl();
                    local_1370 = vpbroadcastd_avx512vl();
                    local_1360 = ZEXT416(*(uint *)(ray + local_1378 * 4 + 0x80));
                    do {
                      uVar7 = *(undefined4 *)(local_1100 + uVar42 * 4);
                      local_1000._4_4_ = uVar7;
                      local_1000._0_4_ = uVar7;
                      local_1000._8_4_ = uVar7;
                      local_1000._12_4_ = uVar7;
                      uVar7 = *(undefined4 *)(local_10e0 + uVar42 * 4);
                      local_ff0._4_4_ = uVar7;
                      local_ff0._0_4_ = uVar7;
                      local_ff0._8_4_ = uVar7;
                      local_ff0._12_4_ = uVar7;
                      *(float *)(ray + k * 4 + 0x80) = local_10a0[uVar42 - 8];
                      local_12b0.context = context->user;
                      local_1030 = local_10a0[uVar42];
                      fVar123 = local_1080[uVar42];
                      local_1020._4_4_ = fVar123;
                      local_1020._0_4_ = fVar123;
                      local_1020._8_4_ = fVar123;
                      local_1020._12_4_ = fVar123;
                      uVar7 = *(undefined4 *)(local_1060 + uVar42 * 4);
                      local_1010._4_4_ = uVar7;
                      local_1010._0_4_ = uVar7;
                      local_1010._8_4_ = uVar7;
                      local_1010._12_4_ = uVar7;
                      fStack_102c = local_1030;
                      fStack_1028 = local_1030;
                      fStack_1024 = local_1030;
                      local_fe0 = local_1370._0_8_;
                      uStack_fd8 = local_1370._8_8_;
                      local_fd0 = local_1350;
                      vpcmpeqd_avx2(ZEXT1632(local_1350),ZEXT1632(local_1350));
                      uStack_fbc = (local_12b0.context)->instID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = (local_12b0.context)->instPrimID[0];
                      uStack_fac = uStack_fb0;
                      uStack_fa8 = uStack_fb0;
                      uStack_fa4 = uStack_fb0;
                      local_1340 = local_11a0;
                      local_12b0.valid = (int *)local_1340;
                      local_12b0.geometryUserPtr = pGVar13->userPtr;
                      local_12b0.hit = (RTCHitN *)&local_1030;
                      local_12b0.N = 4;
                      local_12b0.ray = (RTCRayN *)ray;
                      if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar13->intersectionFilterN)(&local_12b0);
                        auVar133 = ZEXT3264(local_1280);
                        k = local_1378;
                      }
                      uVar43 = vptestmd_avx512vl(local_1340,local_1340);
                      if ((uVar43 & 0xf) == 0) {
LAB_01cf601e:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_1360._0_4_;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_12b0);
                          auVar133 = ZEXT3264(local_1280);
                          k = local_1378;
                        }
                        uVar43 = vptestmd_avx512vl(local_1340,local_1340);
                        uVar43 = uVar43 & 0xf;
                        bVar48 = (byte)uVar43;
                        if (bVar48 == 0) goto LAB_01cf601e;
                        fVar123 = *(float *)(local_12b0.hit + 4);
                        fVar51 = *(float *)(local_12b0.hit + 8);
                        fVar96 = *(float *)(local_12b0.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar43 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar43 >> 2) & 1);
                        bVar18 = SUB81(uVar43 >> 3,0);
                        *(uint *)(local_12b0.ray + 0xc0) =
                             (uint)(bVar48 & 1) * (int)*(float *)local_12b0.hit |
                             (uint)!(bool)(bVar48 & 1) * *(int *)(local_12b0.ray + 0xc0);
                        *(uint *)(local_12b0.ray + 0xc4) =
                             (uint)bVar16 * (int)fVar123 |
                             (uint)!bVar16 * *(int *)(local_12b0.ray + 0xc4);
                        *(uint *)(local_12b0.ray + 200) =
                             (uint)bVar17 * (int)fVar51 |
                             (uint)!bVar17 * *(int *)(local_12b0.ray + 200);
                        *(uint *)(local_12b0.ray + 0xcc) =
                             (uint)bVar18 * (int)fVar96 |
                             (uint)!bVar18 * *(int *)(local_12b0.ray + 0xcc);
                        fVar123 = *(float *)(local_12b0.hit + 0x14);
                        fVar51 = *(float *)(local_12b0.hit + 0x18);
                        fVar96 = *(float *)(local_12b0.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar43 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar43 >> 2) & 1);
                        bVar18 = SUB81(uVar43 >> 3,0);
                        *(uint *)(local_12b0.ray + 0xd0) =
                             (uint)(bVar48 & 1) * (int)*(float *)(local_12b0.hit + 0x10) |
                             (uint)!(bool)(bVar48 & 1) * *(int *)(local_12b0.ray + 0xd0);
                        *(uint *)(local_12b0.ray + 0xd4) =
                             (uint)bVar16 * (int)fVar123 |
                             (uint)!bVar16 * *(int *)(local_12b0.ray + 0xd4);
                        *(uint *)(local_12b0.ray + 0xd8) =
                             (uint)bVar17 * (int)fVar51 |
                             (uint)!bVar17 * *(int *)(local_12b0.ray + 0xd8);
                        *(uint *)(local_12b0.ray + 0xdc) =
                             (uint)bVar18 * (int)fVar96 |
                             (uint)!bVar18 * *(int *)(local_12b0.ray + 0xdc);
                        fVar123 = *(float *)(local_12b0.hit + 0x24);
                        fVar51 = *(float *)(local_12b0.hit + 0x28);
                        fVar96 = *(float *)(local_12b0.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar43 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar43 >> 2) & 1);
                        bVar18 = SUB81(uVar43 >> 3,0);
                        *(uint *)(local_12b0.ray + 0xe0) =
                             (uint)(bVar48 & 1) * (int)*(float *)(local_12b0.hit + 0x20) |
                             (uint)!(bool)(bVar48 & 1) * *(int *)(local_12b0.ray + 0xe0);
                        *(uint *)(local_12b0.ray + 0xe4) =
                             (uint)bVar16 * (int)fVar123 |
                             (uint)!bVar16 * *(int *)(local_12b0.ray + 0xe4);
                        *(uint *)(local_12b0.ray + 0xe8) =
                             (uint)bVar17 * (int)fVar51 |
                             (uint)!bVar17 * *(int *)(local_12b0.ray + 0xe8);
                        *(uint *)(local_12b0.ray + 0xec) =
                             (uint)bVar18 * (int)fVar96 |
                             (uint)!bVar18 * *(int *)(local_12b0.ray + 0xec);
                        fVar123 = *(float *)(local_12b0.hit + 0x34);
                        fVar51 = *(float *)(local_12b0.hit + 0x38);
                        fVar96 = *(float *)(local_12b0.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar43 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar43 >> 2) & 1);
                        bVar18 = SUB81(uVar43 >> 3,0);
                        *(uint *)(local_12b0.ray + 0xf0) =
                             (uint)(bVar48 & 1) * (int)*(float *)(local_12b0.hit + 0x30) |
                             (uint)!(bool)(bVar48 & 1) * *(int *)(local_12b0.ray + 0xf0);
                        *(uint *)(local_12b0.ray + 0xf4) =
                             (uint)bVar16 * (int)fVar123 |
                             (uint)!bVar16 * *(int *)(local_12b0.ray + 0xf4);
                        *(uint *)(local_12b0.ray + 0xf8) =
                             (uint)bVar17 * (int)fVar51 |
                             (uint)!bVar17 * *(int *)(local_12b0.ray + 0xf8);
                        *(uint *)(local_12b0.ray + 0xfc) =
                             (uint)bVar18 * (int)fVar96 |
                             (uint)!bVar18 * *(int *)(local_12b0.ray + 0xfc);
                        fVar123 = *(float *)(local_12b0.hit + 0x44);
                        fVar51 = *(float *)(local_12b0.hit + 0x48);
                        fVar96 = *(float *)(local_12b0.hit + 0x4c);
                        bVar16 = (bool)((byte)(uVar43 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar43 >> 2) & 1);
                        bVar18 = SUB81(uVar43 >> 3,0);
                        *(uint *)(local_12b0.ray + 0x100) =
                             (uint)(bVar48 & 1) * (int)*(float *)(local_12b0.hit + 0x40) |
                             (uint)!(bool)(bVar48 & 1) * *(int *)(local_12b0.ray + 0x100);
                        *(uint *)(local_12b0.ray + 0x104) =
                             (uint)bVar16 * (int)fVar123 |
                             (uint)!bVar16 * *(int *)(local_12b0.ray + 0x104);
                        *(uint *)(local_12b0.ray + 0x108) =
                             (uint)bVar17 * (int)fVar51 |
                             (uint)!bVar17 * *(int *)(local_12b0.ray + 0x108);
                        *(uint *)(local_12b0.ray + 0x10c) =
                             (uint)bVar18 * (int)fVar96 |
                             (uint)!bVar18 * *(int *)(local_12b0.ray + 0x10c);
                        auVar52 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x50));
                        *(undefined1 (*) [16])(local_12b0.ray + 0x110) = auVar52;
                        auVar52 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x60));
                        *(undefined1 (*) [16])(local_12b0.ray + 0x120) = auVar52;
                        auVar52 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x70));
                        *(undefined1 (*) [16])(local_12b0.ray + 0x130) = auVar52;
                        auVar52 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x80));
                        *(undefined1 (*) [16])(local_12b0.ray + 0x140) = auVar52;
                        local_1360._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_1360._4_4_ = 0;
                        local_1360._8_4_ = 0;
                        local_1360._12_4_ = 0;
                      }
                      bVar48 = ~(byte)(1 << ((uint)uVar42 & 0x1f)) & (byte)uVar39;
                      auVar109._4_4_ = local_1360._0_4_;
                      auVar109._0_4_ = local_1360._0_4_;
                      auVar109._8_4_ = local_1360._0_4_;
                      auVar109._12_4_ = local_1360._0_4_;
                      auVar109._16_4_ = local_1360._0_4_;
                      auVar109._20_4_ = local_1360._0_4_;
                      auVar109._24_4_ = local_1360._0_4_;
                      auVar109._28_4_ = local_1360._0_4_;
                      uVar23 = vcmpps_avx512vl(auVar133._0_32_,auVar109,2);
                      if ((bVar48 & (byte)uVar23) == 0) goto LAB_01cf5d3f;
                      bVar48 = bVar48 & (byte)uVar23;
                      uVar39 = (ulong)bVar48;
                      auVar110._8_4_ = 0x7f800000;
                      auVar110._0_8_ = 0x7f8000007f800000;
                      auVar110._12_4_ = 0x7f800000;
                      auVar110._16_4_ = 0x7f800000;
                      auVar110._20_4_ = 0x7f800000;
                      auVar110._24_4_ = 0x7f800000;
                      auVar110._28_4_ = 0x7f800000;
                      auVar93 = vblendmps_avx512vl(auVar110,auVar133._0_32_);
                      auVar95._0_4_ =
                           (uint)(bVar48 & 1) * auVar93._0_4_ |
                           (uint)!(bool)(bVar48 & 1) * 0x7f800000;
                      bVar16 = (bool)(bVar48 >> 1 & 1);
                      auVar95._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar48 >> 2 & 1);
                      auVar95._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar48 >> 3 & 1);
                      auVar95._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar48 >> 4 & 1);
                      auVar95._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar48 >> 5 & 1);
                      auVar95._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * 0x7f800000;
                      bVar16 = (bool)(bVar48 >> 6 & 1);
                      auVar95._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * 0x7f800000;
                      auVar95._28_4_ =
                           (uint)(bVar48 >> 7) * auVar93._28_4_ |
                           (uint)!(bool)(bVar48 >> 7) * 0x7f800000;
                      auVar93 = vshufps_avx(auVar95,auVar95,0xb1);
                      auVar93 = vminps_avx(auVar95,auVar93);
                      auVar90 = vshufpd_avx(auVar93,auVar93,5);
                      auVar93 = vminps_avx(auVar93,auVar90);
                      auVar90 = vpermpd_avx2(auVar93,0x4e);
                      auVar93 = vminps_avx(auVar93,auVar90);
                      uVar23 = vcmpps_avx512vl(auVar95,auVar93,0);
                      bVar31 = (byte)uVar23 & bVar48;
                      if (bVar31 != 0) {
                        bVar48 = bVar31;
                      }
                      uVar34 = 0;
                      for (uVar36 = (uint)bVar48; (uVar36 & 1) == 0;
                          uVar36 = uVar36 >> 1 | 0x80000000) {
                        uVar34 = uVar34 + 1;
                      }
                      uVar42 = (ulong)uVar34;
                    } while( true );
                  }
                  uVar7 = *(undefined4 *)(local_1100 + uVar42 * 4);
                  uVar9 = *(undefined4 *)(local_10e0 + uVar42 * 4);
                  fVar123 = local_10a0[uVar42];
                  fVar51 = local_1080[uVar42];
                  uVar10 = *(undefined4 *)(local_1060 + uVar42 * 4);
                  *(float *)(ray + local_1378 * 4 + 0x80) = local_10a0[uVar42 - 8];
                  *(float *)(ray + local_1378 * 4 + 0xc0) = fVar123;
                  *(float *)(ray + local_1378 * 4 + 0xd0) = fVar51;
                  *(undefined4 *)(ray + local_1378 * 4 + 0xe0) = uVar10;
                  *(undefined4 *)(ray + local_1378 * 4 + 0xf0) = uVar7;
                  *(undefined4 *)(ray + local_1378 * 4 + 0x100) = uVar9;
                  *(uint *)(ray + local_1378 * 4 + 0x110) = uVar36;
                  *(uint *)(ray + local_1378 * 4 + 0x120) = uVar34;
                  *(uint *)(ray + local_1378 * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + local_1378 * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
LAB_01cf5d3f:
          auVar141 = ZEXT1664(local_11c0);
          auVar144 = ZEXT1664(local_11d0);
          auVar146 = ZEXT1664(local_1200);
          auVar147 = ZEXT1664(local_1210);
          auVar148 = ZEXT1664(local_11b0);
          uVar39 = local_1380;
          pauVar40 = local_12c8;
          uVar42 = local_12d0;
          uVar43 = local_12d8;
          uVar44 = local_12e8;
          uVar45 = local_12f0;
          uVar46 = local_12e0;
          fVar123 = local_11e0;
          fVar96 = fStack_11dc;
          fVar97 = fStack_11d8;
          fVar98 = fStack_11d4;
          fVar51 = local_11f0;
          fVar99 = fStack_11ec;
          fVar100 = fStack_11e8;
          fVar101 = fStack_11e4;
        }
      }
      auVar139 = ZEXT1664(local_1220);
      auVar136 = ZEXT1664(local_1230);
      auVar140 = ZEXT1664(local_1240);
      auVar133 = ZEXT1664(local_1250);
    }
    auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
    auVar148 = ZEXT1664(auVar52);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }